

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseStorage.h
# Opt level: O1

void __thiscall
Eigen::DenseStorage<int,_-1,_-1,_1,_0>::conservativeResize
          (DenseStorage<int,__1,__1,_1,_0> *this,Index size,Index rows,Index param_3)

{
  int *piVar1;
  undefined8 *puVar2;
  
  if (((ulong)size >> 0x3e == 0) && ((ulong)this->m_rows < 0x4000000000000000)) {
    piVar1 = (int *)realloc(this->m_data,size * 4);
    if (size == 0 || piVar1 != (int *)0x0) {
      this->m_data = piVar1;
      this->m_rows = rows;
      return;
    }
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = std::streambuf::xsgetn;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

EIGEN_DEVICE_FUNC DenseStorage() : m_rows(0) {}